

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O1

void cb_OK(Fl_Button *param_1,void *param_2)

{
  Fl_Preferences opt_prefs;
  Fl_Preferences prefs;
  Fl_Preferences FStack_38;
  Fl_Preferences local_20;
  
  Fl_Preferences::Fl_Preferences(&local_20,SYSTEM,"fltk.org","fltk");
  Fl_Preferences::Fl_Preferences(&FStack_38,&local_20,"options");
  if (opt[0][1] == 2) {
    Fl_Preferences::deleteEntry(&FStack_38,"ArrowFocus");
  }
  else {
    Fl_Preferences::set(&FStack_38,"ArrowFocus",opt[0][1]);
  }
  if (opt[1][1] == 2) {
    Fl_Preferences::deleteEntry(&FStack_38,"VisibleFocus");
  }
  else {
    Fl_Preferences::set(&FStack_38,"VisibleFocus",opt[1][1]);
  }
  if (opt[2][1] == 2) {
    Fl_Preferences::deleteEntry(&FStack_38,"DNDText");
  }
  else {
    Fl_Preferences::set(&FStack_38,"DNDText",opt[2][1]);
  }
  if (opt[3][1] == 2) {
    Fl_Preferences::deleteEntry(&FStack_38,"ShowTooltips");
  }
  else {
    Fl_Preferences::set(&FStack_38,"ShowTooltips",opt[3][1]);
  }
  if (opt[4][1] == 2) {
    Fl_Preferences::deleteEntry(&FStack_38,"FNFCUsesGTK");
  }
  else {
    Fl_Preferences::set(&FStack_38,"FNFCUsesGTK",opt[4][1]);
  }
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&FStack_38);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_20);
  Fl_Preferences::Fl_Preferences(&local_20,USER,"fltk.org","fltk");
  Fl_Preferences::Fl_Preferences(&FStack_38,&local_20,"options");
  if (opt[0][0] == 2) {
    Fl_Preferences::deleteEntry(&FStack_38,"ArrowFocus");
  }
  else {
    Fl_Preferences::set(&FStack_38,"ArrowFocus",opt[0][0]);
  }
  if (opt[1][0] == 2) {
    Fl_Preferences::deleteEntry(&FStack_38,"VisibleFocus");
  }
  else {
    Fl_Preferences::set(&FStack_38,"VisibleFocus",opt[1][0]);
  }
  if (opt[2][0] == 2) {
    Fl_Preferences::deleteEntry(&FStack_38,"DNDText");
  }
  else {
    Fl_Preferences::set(&FStack_38,"DNDText",opt[2][0]);
  }
  if (opt[3][0] == 2) {
    Fl_Preferences::deleteEntry(&FStack_38,"ShowTooltips");
  }
  else {
    Fl_Preferences::set(&FStack_38,"ShowTooltips",opt[3][0]);
  }
  if (opt[4][0] == 2) {
    Fl_Preferences::deleteEntry(&FStack_38,"FNFCUsesGTK");
  }
  else {
    Fl_Preferences::set(&FStack_38,"FNFCUsesGTK",opt[4][0]);
  }
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&FStack_38);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_20);
  (*(global_settings_window->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  return;
}

Assistant:

static void writePrefs() {
  // write all preferences using the array
  {
    Fl_Preferences prefs(Fl_Preferences::SYSTEM, "fltk.org", "fltk");
    Fl_Preferences opt_prefs(prefs, "options");
    if (opt[Fl::OPTION_ARROW_FOCUS][1]==2) opt_prefs.deleteEntry("ArrowFocus");
    else opt_prefs.set("ArrowFocus", opt[Fl::OPTION_ARROW_FOCUS][1]);
    if (opt[Fl::OPTION_VISIBLE_FOCUS][1]==2) opt_prefs.deleteEntry("VisibleFocus");
    else opt_prefs.set("VisibleFocus", opt[Fl::OPTION_VISIBLE_FOCUS][1]);
    if (opt[Fl::OPTION_DND_TEXT][1]==2) opt_prefs.deleteEntry("DNDText");
    else opt_prefs.set("DNDText", opt[Fl::OPTION_DND_TEXT][1]);
    if (opt[Fl::OPTION_SHOW_TOOLTIPS][1]==2) opt_prefs.deleteEntry("ShowTooltips");
    else opt_prefs.set("ShowTooltips", opt[Fl::OPTION_SHOW_TOOLTIPS][1]);
    if (opt[Fl::OPTION_FNFC_USES_GTK][1]==2) opt_prefs.deleteEntry("FNFCUsesGTK");
    else opt_prefs.set("FNFCUsesGTK", opt[Fl::OPTION_FNFC_USES_GTK][1]);
  }
  {
    Fl_Preferences prefs(Fl_Preferences::USER, "fltk.org", "fltk");
    Fl_Preferences opt_prefs(prefs, "options");
    if (opt[Fl::OPTION_ARROW_FOCUS][0]==2) opt_prefs.deleteEntry("ArrowFocus");
    else opt_prefs.set("ArrowFocus", opt[Fl::OPTION_ARROW_FOCUS][0]);
    if (opt[Fl::OPTION_VISIBLE_FOCUS][0]==2) opt_prefs.deleteEntry("VisibleFocus");
    else opt_prefs.set("VisibleFocus", opt[Fl::OPTION_VISIBLE_FOCUS][0]);
    if (opt[Fl::OPTION_DND_TEXT][0]==2) opt_prefs.deleteEntry("DNDText");
    else opt_prefs.set("DNDText", opt[Fl::OPTION_DND_TEXT][0]);
    if (opt[Fl::OPTION_SHOW_TOOLTIPS][0]==2) opt_prefs.deleteEntry("ShowTooltips");
    else opt_prefs.set("ShowTooltips", opt[Fl::OPTION_SHOW_TOOLTIPS][0]);
    if (opt[Fl::OPTION_FNFC_USES_GTK][0]==2) opt_prefs.deleteEntry("FNFCUsesGTK");
    else opt_prefs.set("FNFCUsesGTK", opt[Fl::OPTION_FNFC_USES_GTK][0]);
  }
}